

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O1

ConditionalPropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalPropertyExprSyntax,slang::parsing::Token,slang::parsing::Token,slang::syntax::ExpressionSyntax&,slang::parsing::Token,slang::syntax::PropertyExprSyntax&,slang::syntax::ElsePropertyClauseSyntax*>
          (BumpAllocator *this,Token *args,Token *args_1,ExpressionSyntax *args_2,Token *args_3,
          PropertyExprSyntax *args_4,ElsePropertyClauseSyntax **args_5)

{
  ElsePropertyClauseSyntax *pEVar1;
  Info *pIVar2;
  Info *pIVar3;
  Info *pIVar4;
  TokenKind TVar5;
  undefined1 uVar6;
  NumericTokenFlags NVar7;
  uint32_t uVar8;
  TokenKind TVar9;
  undefined1 uVar10;
  NumericTokenFlags NVar11;
  uint32_t uVar12;
  TokenKind TVar13;
  undefined1 uVar14;
  NumericTokenFlags NVar15;
  uint32_t uVar16;
  ConditionalPropertyExprSyntax *pCVar17;
  
  pCVar17 = (ConditionalPropertyExprSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8)
  ;
  if ((ConditionalPropertyExprSyntax *)this->endPtr < pCVar17 + 1) {
    pCVar17 = (ConditionalPropertyExprSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pCVar17 + 1);
  }
  TVar5 = args->kind;
  uVar6 = args->field_0x2;
  NVar7.raw = (args->numFlags).raw;
  uVar8 = args->rawLen;
  pIVar2 = args->info;
  TVar9 = args_1->kind;
  uVar10 = args_1->field_0x2;
  NVar11.raw = (args_1->numFlags).raw;
  uVar12 = args_1->rawLen;
  pIVar3 = args_1->info;
  TVar13 = args_3->kind;
  uVar14 = args_3->field_0x2;
  NVar15.raw = (args_3->numFlags).raw;
  uVar16 = args_3->rawLen;
  pIVar4 = args_3->info;
  pEVar1 = *args_5;
  (pCVar17->super_PropertyExprSyntax).super_SyntaxNode.kind = ConditionalPropertyExpr;
  (pCVar17->super_PropertyExprSyntax).super_SyntaxNode.parent = (SyntaxNode *)0x0;
  (pCVar17->super_PropertyExprSyntax).super_SyntaxNode.previewNode = (SyntaxNode *)0x0;
  (pCVar17->ifKeyword).kind = TVar5;
  (pCVar17->ifKeyword).field_0x2 = uVar6;
  (pCVar17->ifKeyword).numFlags = (NumericTokenFlags)NVar7.raw;
  (pCVar17->ifKeyword).rawLen = uVar8;
  (pCVar17->ifKeyword).info = pIVar2;
  (pCVar17->openParen).kind = TVar9;
  (pCVar17->openParen).field_0x2 = uVar10;
  (pCVar17->openParen).numFlags = (NumericTokenFlags)NVar11.raw;
  (pCVar17->openParen).rawLen = uVar12;
  (pCVar17->openParen).info = pIVar3;
  (pCVar17->condition).ptr = args_2;
  (pCVar17->closeParen).kind = TVar13;
  (pCVar17->closeParen).field_0x2 = uVar14;
  (pCVar17->closeParen).numFlags = (NumericTokenFlags)NVar15.raw;
  (pCVar17->closeParen).rawLen = uVar16;
  (pCVar17->closeParen).info = pIVar4;
  (pCVar17->expr).ptr = args_4;
  pCVar17->elseClause = pEVar1;
  (args_2->super_SyntaxNode).parent = (SyntaxNode *)pCVar17;
  (args_4->super_SyntaxNode).parent = (SyntaxNode *)pCVar17;
  if (pEVar1 != (ElsePropertyClauseSyntax *)0x0) {
    (pEVar1->super_SyntaxNode).parent = (SyntaxNode *)pCVar17;
  }
  return pCVar17;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }